

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::computeIntermediateMatrix
          (HPresolve *this,vector<int,_std::allocator<int>_> *flagRow,
          vector<int,_std::allocator<int>_> *flagCol,size_t *numreductions)

{
  HighsLp *pHVar1;
  pointer puVar2;
  pointer piVar3;
  ulong uVar4;
  HighsPostsolveStack stack;
  
  this->shrinkProblemEnabled = false;
  stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack.debug_prev_row_upper = 0.0;
  stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stack.debug_prev_col_upper = 0.0;
  stack.debug_prev_row_lower = 0.0;
  stack.debug_prev_numreductions = 0;
  stack.debug_prev_col_lower = 0.0;
  memset(&stack.reductions,0,0x90);
  stack.origNumCol = -1;
  stack.origNumRow = -1;
  HighsPostsolveStack::initializeIndexMaps
            (&stack,(HighsInt)
                    ((ulong)((long)(flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 2),
             (HighsInt)
             ((ulong)((long)(flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2));
  this->reductionLimit = *numreductions;
  presolve(this,&stack);
  *numreductions =
       (long)stack.reductions.
             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)stack.reductions.
             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  pHVar1 = this->model;
  toCSC(this,&(pHVar1->a_matrix_).value_,&(pHVar1->a_matrix_).index_,&(pHVar1->a_matrix_).start_);
  pHVar1 = this->model;
  puVar2 = (this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = (flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar4 = 0; uVar4 != (uint)pHVar1->num_row_; uVar4 = uVar4 + 1) {
    piVar3[uVar4] = 1 - (uint)puVar2[uVar4];
  }
  puVar2 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = (flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar4 = 0; uVar4 != (uint)pHVar1->num_col_; uVar4 = uVar4 + 1) {
    piVar3[uVar4] = 1 - (uint)puVar2[uVar4];
  }
  HighsPostsolveStack::~HighsPostsolveStack(&stack);
  return;
}

Assistant:

void HPresolve::computeIntermediateMatrix(std::vector<HighsInt>& flagRow,
                                          std::vector<HighsInt>& flagCol,
                                          size_t& numreductions) {
  shrinkProblemEnabled = false;
  HighsPostsolveStack stack;
  stack.initializeIndexMaps(flagRow.size(), flagCol.size());
  setReductionLimit(numreductions);
  presolve(stack);
  numreductions = stack.numReductions();

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);

  for (HighsInt i = 0; i != model->num_row_; ++i)
    flagRow[i] = 1 - rowDeleted[i];
  for (HighsInt i = 0; i != model->num_col_; ++i)
    flagCol[i] = 1 - colDeleted[i];
}